

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-to-json.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  uint8_t *start_00;
  char *pcVar5;
  size_type sVar6;
  void *pvVar7;
  ValueLength VVar8;
  long in_RSI;
  int in_EDI;
  exception *ex;
  char *start;
  ofstream ofs;
  Exception *ex_1;
  Dumper dumper;
  CharBufferSink sink;
  Buffer<char> buffer;
  Slice slice;
  Validator validator;
  Options options;
  char buffer_1 [32768];
  ifstream ifs;
  string s;
  string infile;
  bool toStdOut;
  char *p;
  int i;
  bool validate;
  bool hex;
  bool printUnsupported;
  bool pretty;
  bool allowFlags;
  char *outfileName;
  char *infileName;
  undefined7 in_stack_ffffffffffff7898;
  undefined1 in_stack_ffffffffffff789f;
  Buffer<char> *in_stack_ffffffffffff78a0;
  Dumper *in_stack_ffffffffffff78a8;
  Slice in_stack_ffffffffffff78b0;
  size_type in_stack_ffffffffffff78b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff78c0;
  allocator<char> *in_stack_ffffffffffff78d0;
  string *in_stack_ffffffffffff78d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff78e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff78e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff78f0;
  Buffer<char> *this;
  undefined8 local_8630;
  undefined8 local_8628;
  char local_8620 [520];
  uint8_t *local_8418;
  Buffer<char> local_83e8;
  Slice local_8310 [3];
  undefined4 local_82f8;
  byte local_82de;
  undefined1 local_82da;
  undefined1 local_82d9;
  undefined1 local_82a8 [32772];
  undefined4 local_2a4;
  char local_2a0 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_71;
  string local_70 [35];
  byte local_4d;
  char *local_40;
  int local_34;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  char *local_28;
  char *local_20;
  long local_18;
  int local_10;
  int local_c;
  undefined8 local_8;
  
  local_c = 0;
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  local_29 = 1;
  local_2a = 1;
  local_2b = 1;
  local_2c = 0;
  local_2d = 1;
  local_34 = 1;
  local_18 = in_RSI;
  local_10 = in_EDI;
  while( true ) {
    if (local_10 <= local_34) {
      if (local_20 == (char *)0x0) {
        local_20 = "-";
      }
      if (local_20 == (char *)0x0) {
        usage((char **)0x1048d2);
        local_c = 1;
      }
      else {
        local_4d = 0;
        if ((local_28 == (char *)0x0) || (iVar3 = strcmp(local_28,"+"), iVar3 == 0)) {
          local_28 = "/proc/self/fd/1";
          local_4d = 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffff78e0,(char *)in_stack_ffffffffffff78d8,
                   in_stack_ffffffffffff78d0);
        std::allocator<char>::~allocator(&local_71);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffff78a0,
                                (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898
                                                ));
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff78a0,
                     (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898));
        }
        std::__cxx11::string::string(in_stack_ffffffffffff78c0);
        std::ifstream::ifstream(local_2a0,local_70,_S_in);
        bVar2 = std::ifstream::is_open();
        if ((bVar2 & 1) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot read infile \'");
          poVar4 = std::operator<<(poVar4,local_70);
          poVar4 = std::operator<<(poVar4,"\'");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_c = 1;
          local_2a4 = 1;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                    (in_stack_ffffffffffff78c0,in_stack_ffffffffffff78b8);
          while (bVar2 = std::ios::good(), (bVar2 & 1) != 0) {
            std::istream::read(local_2a0,(long)local_82a8);
            local_8 = std::istream::gcount();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff78b0._start,(char *)in_stack_ffffffffffff78a8,
                       (size_type)in_stack_ffffffffffff78a0);
          }
          std::ifstream::close();
          if ((local_2c & 1) != 0) {
            convertFromHex(in_stack_ffffffffffff78d8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_ffffffffffff78f0,in_stack_ffffffffffff78e8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff78a0);
          }
          arangodb::velocypack::Options::Options((Options *)in_stack_ffffffffffff78a0);
          local_82de = local_2a & 1;
          local_82d9 = 1;
          local_82da = 1;
          local_82f8 = 2;
          if ((local_2b & 1) != 0) {
            local_82f8 = 1;
          }
          if ((local_2d & 1) != 0) {
            arangodb::velocypack::Validator::Validator
                      ((Validator *)in_stack_ffffffffffff78a0,
                       (Options *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x104c97
                      );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_98);
            arangodb::velocypack::Validator::validate
                      ((Validator *)in_stack_ffffffffffff78b0._start,
                       (uint8_t *)in_stack_ffffffffffff78a8,(size_t)in_stack_ffffffffffff78a0,
                       (bool)in_stack_ffffffffffff789f);
          }
          start_00 = (uint8_t *)
                     std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x104cd7);
          arangodb::velocypack::Slice::Slice(local_8310,start_00);
          arangodb::velocypack::Buffer<char>::Buffer
                    ((Buffer<char> *)in_stack_ffffffffffff78b0._start,
                     (ValueLength)in_stack_ffffffffffff78a8);
          arangodb::velocypack::ByteBufferSinkImpl<char>::ByteBufferSinkImpl
                    ((ByteBufferSinkImpl<char> *)in_stack_ffffffffffff78a0,
                     (Buffer<char> *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898));
          arangodb::velocypack::Dumper::Dumper
                    ((Dumper *)in_stack_ffffffffffff78b0._start,(Sink *)in_stack_ffffffffffff78a8,
                     (Options *)in_stack_ffffffffffff78a0);
          local_8418 = local_8310[0]._start;
          arangodb::velocypack::Dumper::dump(in_stack_ffffffffffff78a8,in_stack_ffffffffffff78b0);
          std::ofstream::ofstream(local_8620,local_28,_S_out);
          bVar2 = std::ofstream::is_open();
          if ((bVar2 & 1) == 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot write outfile \'");
            poVar4 = std::operator<<(poVar4,local_28);
            poVar4 = std::operator<<(poVar4,"\'");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            local_c = 1;
            local_2a4 = 1;
          }
          else {
            if ((local_4d & 1) == 0) {
              std::fpos<__mbstate_t>::fpos
                        ((fpos<__mbstate_t> *)in_stack_ffffffffffff78a0,
                         CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898));
              std::ostream::seekp(local_8620,local_8630,local_8628);
            }
            this = &local_83e8;
            pcVar5 = arangodb::velocypack::Buffer<char>::data(this);
            arangodb::velocypack::Buffer<char>::size(this);
            std::ostream::write(local_8620,(long)pcVar5);
            std::ofstream::close();
            if ((local_4d & 1) == 0) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Successfully converted JSON infile \'"
                                      );
              poVar4 = std::operator<<(poVar4,local_70);
              poVar4 = std::operator<<(poVar4,"\'");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)&std::cout,"VPack Infile size: ");
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&local_98);
              pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
              std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)&std::cout,"JSON Outfile size: ");
              VVar8 = arangodb::velocypack::Buffer<char>::size(&local_83e8);
              pvVar7 = (void *)std::ostream::operator<<(poVar4,VVar8);
              std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
            }
            local_2a4 = 0;
          }
          std::ofstream::~ofstream(local_8620);
          arangodb::velocypack::Buffer<char>::~Buffer(in_stack_ffffffffffff78a0);
        }
        std::ifstream::~ifstream(local_2a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff78a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff78a0);
      }
      return local_c;
    }
    local_40 = *(char **)(local_18 + (long)local_34 * 8);
    if (((local_29 & 1) != 0) &&
       (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                         (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898)),
       bVar1)) break;
    if (((local_29 & 1) == 0) ||
       (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                         (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898)),
       !bVar1)) {
      if (((local_29 & 1) == 0) ||
         (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                           (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898)),
         !bVar1)) {
        if (((local_29 & 1) == 0) ||
           (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                             (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898)),
           !bVar1)) {
          if (((local_29 & 1) == 0) ||
             (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                               (char *)CONCAT17(in_stack_ffffffffffff789f,in_stack_ffffffffffff7898)
                              ), !bVar1)) {
            if (((local_29 & 1) == 0) ||
               (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                                 (char *)CONCAT17(in_stack_ffffffffffff789f,
                                                  in_stack_ffffffffffff7898)), !bVar1)) {
              if (((local_29 & 1) == 0) ||
                 (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                                   (char *)CONCAT17(in_stack_ffffffffffff789f,
                                                    in_stack_ffffffffffff7898)), !bVar1)) {
                if (((local_29 & 1) == 0) ||
                   (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                                     (char *)CONCAT17(in_stack_ffffffffffff789f,
                                                      in_stack_ffffffffffff7898)), !bVar1)) {
                  if (((local_29 & 1) == 0) ||
                     (bVar1 = isOption((char *)in_stack_ffffffffffff78a0,
                                       (char *)CONCAT17(in_stack_ffffffffffff789f,
                                                        in_stack_ffffffffffff7898)), !bVar1)) {
                    if (local_20 == (char *)0x0) {
                      local_20 = local_40;
                    }
                    else {
                      if (local_28 != (char *)0x0) {
                        usage((char **)0x104864);
                        return 1;
                      }
                      local_28 = local_40;
                    }
                  }
                  else {
                    local_29 = 0;
                  }
                }
                else {
                  local_2d = 0;
                }
              }
              else {
                local_2d = 1;
              }
            }
            else {
              local_2c = 1;
            }
          }
          else {
            local_2b = 0;
          }
        }
        else {
          local_2b = 1;
        }
      }
      else {
        local_2a = 0;
      }
    }
    else {
      local_2a = 1;
    }
    local_34 = local_34 + 1;
  }
  usage((char **)0x1045ed);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool pretty = true;
  bool printUnsupported = true;
  bool hex = false;
  bool validate = true;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--pretty")) {
      pretty = true;
    } else if (allowFlags && isOption(p, "--no-pretty")) {
      pretty = false;
    } else if (allowFlags && isOption(p, "--print-unsupported")) {
      printUnsupported = true;
    } else if (allowFlags && isOption(p, "--no-print-unsupported")) {
      printUnsupported = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--validate")) {
      validate = true;
    } else if (allowFlags && isOption(p, "--no-validate")) {
      validate = false;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.prettyPrint = pretty;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;
  options.unsupportedTypeBehavior =
      (printUnsupported ? Options::ConvertUnsupportedType
                        : Options::FailOnUnsupportedType);

  if (validate) {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
  }

  Slice const slice(reinterpret_cast<uint8_t const*>(s.data()));

  Buffer<char> buffer(4096);
  CharBufferSink sink(&buffer);
  Dumper dumper(&sink, &options);

  try {
    dumper.dump(slice);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  char const* start = buffer.data();
  ofs.write(start, buffer.size());

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "VPack Infile size: " << s.size() << std::endl;
    std::cout << "JSON Outfile size: " << buffer.size() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}